

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::ParseTable(Parser *this,StructDef *struct_def,string *value,uoffset_t *ovalue)

{
  undefined8 *puVar1;
  FlatBufferBuilderImpl<false> *pFVar2;
  string **ppsVar3;
  uoffset_t *puVar4;
  pointer pcVar5;
  pointer pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int iVar7;
  pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *ppVar8;
  bool bVar9;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> t;
  uoffset_t uVar10;
  int iVar11;
  Offset<void> OVar12;
  FieldDef *__rhs_00;
  Value *pVVar13;
  size_t sVar14;
  uint8_t *puVar15;
  long lVar16;
  CheckedError *ce;
  int t_00;
  StructDef *struct_def_00;
  Builder *pBVar17;
  uoffset_t *in_R8;
  pointer pcVar18;
  long lVar19;
  Value *pVVar20;
  Value *val_00;
  ulong uVar21;
  pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *ppVar22;
  const_iterator __position;
  CheckedError ce_1;
  StructDef *local_1a8;
  Builder builder;
  Value val;
  string name;
  ParseDepthGuard depth_guard;
  
  ParseDepthGuard::ParseDepthGuard(&depth_guard,(Parser *)struct_def);
  ParseDepthGuard::Check((ParseDepthGuard *)this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f95;
  CheckedError::~CheckedError((CheckedError *)this);
  iVar11 = *(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc);
  t_00 = (int)struct_def;
  if (iVar11 == 0x5b) {
    Next((Parser *)&ce_1);
    if (ce_1.is_error_ == false) {
      iVar7 = 0x5d;
LAB_001198a4:
      ce_1.has_been_checked_ = true;
      CheckedError::~CheckedError(&ce_1);
      pFVar2 = (FlatBufferBuilderImpl<false> *)
               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
                _M_node_count;
      local_1a8 = (StructDef *)0x0;
      do {
        if (((byte)(local_1a8 == (StructDef *)0x0 |
                   struct_def[3].super_Definition.name.field_2._M_local_buf[2] ^ 1U) == 1) &&
           (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == iVar7)) {
LAB_00119db5:
          Next((Parser *)&ce_1);
          ce_1.has_been_checked_ = true;
          if (ce_1.is_error_ == false) {
            CheckedError::~CheckedError(&ce_1);
            if ((iVar11 == 0x5b) &&
               (local_1a8 !=
                (StructDef *)
                ((long)value[8]._M_dataplus._M_p - *(long *)((long)&value[7].field_2 + 8) >> 3))) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&builder,"wrong number of unnamed fields in table vector",
                         (allocator<char> *)&val);
              Error((Parser *)&ce_1,(string *)struct_def);
              pBVar17 = &builder;
LAB_00119e6f:
              std::__cxx11::string::~string((string *)pBVar17);
            }
            else {
              ce_1.is_error_ = false;
            }
          }
          goto LAB_00119e74;
        }
        name._M_string_length = 0;
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name.field_2._M_local_buf[0] = '\0';
        if (iVar11 == 0x5b) {
          if (local_1a8 <
              (StructDef *)
              ((long)value[8]._M_dataplus._M_p - *(long *)((long)&value[7].field_2 + 8) >> 3)) {
            std::__cxx11::string::_M_assign((string *)&name);
            goto LAB_00119a0d;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&builder,"too many unnamed fields in nested array",
                     (allocator<char> *)&val);
          Error((Parser *)&ce_1,(string *)struct_def);
          std::__cxx11::string::~string((string *)&builder);
LAB_00119e67:
          pBVar17 = (Builder *)&name;
          goto LAB_00119e6f;
        }
        std::__cxx11::string::_M_assign((string *)&name);
        if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x101) {
          Next((Parser *)&ce_1);
        }
        else {
          Expect((Parser *)&ce_1,t_00);
        }
        ce_1.has_been_checked_ = true;
        if (ce_1.is_error_ != false) {
LAB_00119d99:
          ce_1.has_been_checked_ = true;
          goto LAB_00119e67;
        }
        CheckedError::~CheckedError(&ce_1);
        if (((char)struct_def[4].super_Definition.file._M_string_length != '\x01') ||
           ((*(uint *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) | 0x20) != 0x7b)) {
          Expect((Parser *)&ce_1,t_00);
          ce_1.has_been_checked_ = true;
          if (ce_1.is_error_ != false) goto LAB_00119d99;
          CheckedError::~CheckedError(&ce_1);
        }
LAB_00119a0d:
        bVar9 = std::operator==(&name,"$schema");
        if (bVar9) {
          Expect((Parser *)&ce_1,t_00);
joined_r0x00119b83:
          if (ce_1.is_error_ == false) {
            ce_1.has_been_checked_ = true;
            CheckedError::~CheckedError(&ce_1);
LAB_00119b91:
            ce_1.is_error_ = false;
          }
        }
        else {
          __rhs_00 = SymbolTable<flatbuffers::FieldDef>::Lookup
                               ((SymbolTable<flatbuffers::FieldDef> *)&value[6]._M_string_length,
                                &name);
          if (__rhs_00 == (FieldDef *)0x0) {
            if (*(char *)((long)&struct_def[3].super_Definition.file._M_dataplus._M_p + 4) != '\0')
            {
              SkipAnyJsonValue((Parser *)&ce_1);
              goto joined_r0x00119b83;
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &builder,"unknown field: ",&name);
            pBVar17 = &builder;
            Error((Parser *)&ce_1,(string *)struct_def);
          }
          else {
            bVar9 = IsIdent((Parser *)struct_def,"null");
            if ((bVar9) && (0xb < (__rhs_00->value).type.base_type - BASE_TYPE_UTYPE)) {
              Next((Parser *)&ce_1);
              goto joined_r0x00119b83;
            }
            Value::Value(&val,&__rhs_00->value);
            if (__rhs_00->flexbuffer == true) {
              flexbuffers::Builder::Builder(&builder,0x400,BUILDER_FLAG_SHARE_ALL);
              ParseFlexBufferValue((Parser *)&ce_1,(Builder *)struct_def);
              ce_1.has_been_checked_ = true;
              if (ce_1.is_error_ == false) {
                CheckedError::~CheckedError(&ce_1);
                flexbuffers::Builder::Finish(&builder);
                FlatBufferBuilderImpl<false>::ForceVectorAlignment
                          (pFVar2,(long)builder.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  CONCAT44(builder.buf_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           CONCAT22(builder.buf_.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                                  CONCAT11(builder.buf_.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))),1,8);
                flexbuffers::Builder::Finished(&builder);
                t = FlatBufferBuilderImpl<false>::
                    CreateVector<unsigned_char,std::allocator<unsigned_char>>(pFVar2,&builder.buf_);
                NumToString<unsigned_int>((string *)&stack0xffffffffffffffb0,t.o);
                std::__cxx11::string::operator=
                          ((string *)&val.constant,(string *)&stack0xffffffffffffffb0);
                std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
                flexbuffers::Builder::~Builder(&builder);
LAB_00119c6f:
                lVar19 = *(long *)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header.
                                   _M_header;
                ppVar22 = (pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)(lVar19 + 0x50);
                lVar16 = (long)local_1a8 * -0x50;
                do {
                  __position._M_current =
                       (pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)
                       ((long)local_1a8 * -0x50 + lVar19);
                  if (lVar16 == 0) break;
                  ppVar8 = ppVar22 + -2;
                  if (ppVar8->second == __rhs_00) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&builder,"field set more than once: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs_00);
                    Error((Parser *)&ce_1,(string *)struct_def);
                    std::__cxx11::string::~string((string *)&builder);
                    bVar9 = false;
                    goto LAB_00119d2a;
                  }
                  ppVar22 = ppVar22 + -1;
                  lVar16 = lVar16 + 0x50;
                  __position._M_current = ppVar22;
                } while ((__rhs_00->value).offset <= (ppVar8->second->value).offset);
                Value::Value((Value *)&builder,&val);
                builder.key_pool._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = __rhs_00;
                std::
                vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                ::_M_insert_rval((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                                  *)&struct_def[5].fields,__position,(value_type *)&builder);
                std::__cxx11::string::~string
                          ((string *)
                           &builder.stack_.
                            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
                local_1a8 = (StructDef *)
                            ((long)&(local_1a8->super_Definition).name._M_dataplus._M_p + 1);
                bVar9 = true;
LAB_00119d2a:
                std::__cxx11::string::~string((string *)&val.constant);
                if (bVar9) goto LAB_00119b91;
                goto LAB_00119d47;
              }
              flexbuffers::Builder::~Builder(&builder);
            }
            else {
              if (__rhs_00->nested_flatbuffer == (StructDef *)0x0) {
                ParseAnyValue((Parser *)&ce_1,(Value *)struct_def,(FieldDef *)&val,(size_t)__rhs_00,
                              local_1a8,(size_t)value,false);
              }
              else {
                ParseNestedFlatbuffer
                          ((Parser *)&ce_1,(Value *)struct_def,(FieldDef *)&val,(size_t)__rhs_00,
                           local_1a8);
              }
              ce_1.has_been_checked_ = true;
              if (ce_1.is_error_ == false) {
                CheckedError::~CheckedError(&ce_1);
                goto LAB_00119c6f;
              }
            }
            pBVar17 = (Builder *)&val.constant;
          }
          std::__cxx11::string::~string((string *)pBVar17);
        }
LAB_00119d47:
        ce_1.has_been_checked_ = true;
        if (ce_1.is_error_ != false) goto LAB_00119d99;
        CheckedError::~CheckedError(&ce_1);
        if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == iVar7) {
          std::__cxx11::string::~string((string *)&name);
          goto LAB_00119db5;
        }
        ParseComma((Parser *)&ce_1);
        ce_1.has_been_checked_ = true;
        if (ce_1.is_error_ != false) goto LAB_00119e0f;
        CheckedError::~CheckedError(&ce_1);
        std::__cxx11::string::~string((string *)&name);
      } while( true );
    }
  }
  else {
    Expect((Parser *)&ce_1,t_00);
    if (ce_1.is_error_ == false) {
      iVar7 = 0x7d;
      goto LAB_001198a4;
    }
  }
  local_1a8 = (StructDef *)0x0;
  goto LAB_00119e74;
LAB_00119e0f:
  std::__cxx11::string::~string((string *)&name);
LAB_00119e74:
  *(bool *)&(this->super_ParserState).prev_cursor_ = ce_1.is_error_;
  ce_1.has_been_checked_ = true;
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (ce_1.is_error_ == false) {
    CheckedError::~CheckedError((CheckedError *)this);
    pcVar6 = value[8]._M_dataplus._M_p;
    pcVar5 = *(pointer *)((long)&value[7].field_2 + 8);
    for (pcVar18 = pcVar5; pcVar18 != pcVar6; pcVar18 = pcVar18 + 8) {
      __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pcVar18;
      lVar19 = (long)local_1a8 * 0x50;
      lVar16 = *(long *)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header +
               (long)local_1a8 * -0x50;
      if (*(int *)((long)&__rhs[8].field_2 + 8) == 0) {
        do {
          if (lVar19 == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xffffffffffffffb0,"required field is missing: ",__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &stack0xffffffffffffffb0," in ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &builder,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&val,value);
            Error(this,(string *)struct_def);
            std::__cxx11::string::~string((string *)&builder);
            std::__cxx11::string::~string((string *)&val);
            pBVar17 = (Builder *)&stack0xffffffffffffffb0;
            goto LAB_00119f86;
          }
          puVar1 = (undefined8 *)(lVar16 + 0x48);
          lVar19 = lVar19 + -0x50;
          lVar16 = lVar16 + 0x50;
        } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar1 !=
                 __rhs);
      }
    }
    if (value[8].field_2._M_local_buf[0] == '\x01') {
      if (local_1a8 != (StructDef *)((long)pcVar6 - (long)pcVar5 >> 3)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builder
                       ,"struct: wrong number of initializers: ",value);
        Error(this,(string *)struct_def);
        pBVar17 = &builder;
LAB_00119f86:
        std::__cxx11::string::~string((string *)pBVar17);
        goto LAB_00119f8b;
      }
      uVar10 = FlatBufferBuilderImpl<false>::StartStruct
                         ((FlatBufferBuilderImpl<false> *)
                          &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                           super__Rb_tree_header._M_node_count,
                          *(size_t *)((long)&value[8].field_2 + 8));
    }
    else {
      uVar10 = FlatBufferBuilderImpl<false>::StartTable
                         ((FlatBufferBuilderImpl<false> *)
                          &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                           super__Rb_tree_header._M_node_count);
    }
    uVar21 = 1;
    if (value[8].field_2._M_local_buf[2] != '\0') {
      uVar21 = 8;
    }
    pFVar2 = (FlatBufferBuilderImpl<false> *)
             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
              _M_node_count;
    for (; uVar21 != 0; uVar21 = uVar21 >> 1) {
      pVVar13 = *(Value **)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header;
      pVVar20 = pVVar13;
      while (pVVar20 != (Value *)((long)pVVar13 + (long)local_1a8 * -0x50)) {
        val_00 = (Value *)((long)(pVVar20 + 0xfffffffffffffffe) + 0x40);
        lVar19 = *(long *)((long)(pVVar20 + 0xffffffffffffffff) + 0x40);
        if ((value[8].field_2._M_local_buf[2] != '\x01') ||
           (sVar14 = SizeOf((val_00->type).base_type), uVar21 == sVar14)) {
          switch((val_00->type).base_type) {
          case 0:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(uchar *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                        (pFVar2,(uchar)builder.buf_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(uchar *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (uchar *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (uchar)builder.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                         (undefined1)val.type.base_type);
            }
            break;
          case 1:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(uchar *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                        (pFVar2,(uchar)builder.buf_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(uchar *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (uchar *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (uchar)builder.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                         (undefined1)val.type.base_type);
            }
            break;
          case 2:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(uchar *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                        (pFVar2,(uchar)builder.buf_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(uchar *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (uchar *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (uchar)builder.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                         (undefined1)val.type.base_type);
            }
            break;
          case 3:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<signed_char>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(char *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
                        (pFVar2,(uchar)builder.buf_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<signed_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(char *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<signed_char>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              anon_unknown_0::atot<signed_char>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(char *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<signed_char>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (char *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<signed_char>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (uchar)builder.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                         (undefined1)val.type.base_type);
            }
            break;
          case 4:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(uchar *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                        (pFVar2,(uchar)builder.buf_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(uchar *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (uchar *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (uchar)builder.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                         (undefined1)val.type.base_type);
            }
            break;
          case 5:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<short>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(short *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                        (pFVar2,CONCAT11(builder.buf_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                         (uchar)builder.buf_.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start));
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<short>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(short *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<short>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           CONCAT11(builder.buf_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                    (uchar)builder.buf_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start));
              }
            }
            else {
              anon_unknown_0::atot<short>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(short *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<short>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (short *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<short>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         CONCAT11(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._1_1_,
                                  (uchar)builder.buf_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start),
                         CONCAT11(val.type.base_type._1_1_,(undefined1)val.type.base_type));
            }
            break;
          case 6:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<unsigned_short>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(unsigned_short *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
                        (pFVar2,CONCAT11(builder.buf_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                         (uchar)builder.buf_.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start));
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<unsigned_short>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(unsigned_short *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<unsigned_short>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           CONCAT11(builder.buf_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                    (uchar)builder.buf_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start));
              }
            }
            else {
              anon_unknown_0::atot<unsigned_short>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(unsigned_short *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<unsigned_short>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (unsigned_short *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<unsigned_short>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         CONCAT11(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._1_1_,
                                  (uchar)builder.buf_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start),
                         CONCAT11(val.type.base_type._1_1_,(undefined1)val.type.base_type));
            }
            break;
          case 7:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<int>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(int *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                        (pFVar2,CONCAT22(builder.buf_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                         CONCAT11(builder.buf_.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<int>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(int *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<int>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           CONCAT22(builder.buf_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                    CONCAT11(builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                             (uchar)builder.buf_.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
              }
            }
            else {
              anon_unknown_0::atot<int>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(int *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<int>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (int *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<int>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         CONCAT22(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_2_,
                                  CONCAT11(builder.buf_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (uchar)builder.buf_.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)),
                         CONCAT22(val.type.base_type._2_2_,
                                  CONCAT11(val.type.base_type._1_1_,(undefined1)val.type.base_type))
                        );
            }
            break;
          case 8:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<unsigned_int>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(uint *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                        (pFVar2,CONCAT22(builder.buf_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                         CONCAT11(builder.buf_.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<unsigned_int>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(uint *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<unsigned_int>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           CONCAT22(builder.buf_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                    CONCAT11(builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                             (uchar)builder.buf_.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
              }
            }
            else {
              anon_unknown_0::atot<unsigned_int>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(uint *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<unsigned_int>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (uint *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<unsigned_int>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         CONCAT22(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_2_,
                                  CONCAT11(builder.buf_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (uchar)builder.buf_.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)),
                         CONCAT22(val.type.base_type._2_2_,
                                  CONCAT11(val.type.base_type._1_1_,(undefined1)val.type.base_type))
                        );
            }
            break;
          case 9:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<long>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(long *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
                        (pFVar2,CONCAT44(builder.buf_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         CONCAT22(builder.buf_.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                                  CONCAT11(builder.buf_.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))));
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<long>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(long *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<long>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           CONCAT44(builder.buf_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    CONCAT22(builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                             CONCAT11(builder.buf_.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))));
              }
            }
            else {
              anon_unknown_0::atot<long>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(long *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<long>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (long *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<long>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         CONCAT44(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  CONCAT22(builder.buf_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                           CONCAT11(builder.buf_.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))),
                         CONCAT44(val.type.element,
                                  CONCAT22(val.type.base_type._2_2_,
                                           CONCAT11(val.type.base_type._1_1_,
                                                    (undefined1)val.type.base_type))));
            }
            break;
          case 10:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<unsigned_long>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(unsigned_long *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                        (pFVar2,CONCAT44(builder.buf_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         CONCAT22(builder.buf_.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                                  CONCAT11(builder.buf_.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))));
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<unsigned_long>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(unsigned_long *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           CONCAT44(builder.buf_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    CONCAT22(builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                             CONCAT11(builder.buf_.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))));
              }
            }
            else {
              anon_unknown_0::atot<unsigned_long>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(unsigned_long *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<unsigned_long>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (unsigned_long *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         CONCAT44(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  CONCAT22(builder.buf_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                           CONCAT11(builder.buf_.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))),
                         CONCAT44(val.type.element,
                                  CONCAT22(val.type.base_type._2_2_,
                                           CONCAT11(val.type.base_type._1_1_,
                                                    (undefined1)val.type.base_type))));
            }
            break;
          case 0xb:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<float>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(float *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                        (pFVar2,(float)CONCAT22(builder.buf_.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                                CONCAT11(builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<float>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(float *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<float>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           (float)CONCAT22(builder.buf_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                           CONCAT11(builder.buf_.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
              }
            }
            else {
              anon_unknown_0::atot<float>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(float *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<float>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (float *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<float>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (float)CONCAT22(builder.buf_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                         CONCAT11(builder.buf_.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)),
                         (float)CONCAT22(val.type.base_type._2_2_,
                                         CONCAT11(val.type.base_type._1_1_,
                                                  (undefined1)val.type.base_type)));
            }
            break;
          case 0xc:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if (value[8].field_2._M_local_buf[0] == '\x01') {
              anon_unknown_0::atot<double>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(double *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::PushElement<double,unsigned_int>
                        (pFVar2,(double)CONCAT44(builder.buf_.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 CONCAT22(builder.buf_.
                                                                                                                    
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                                  CONCAT11(builder.buf_.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))));
            }
            else if ((*(int *)(lVar19 + 200) - 1U < 0xc) && (*(int *)(lVar19 + 0x118) == 1)) {
              bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),"null");
              if (bVar9) {
                anon_unknown_0::atot<double>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18U),
                           (Parser *)struct_def,(double *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
                CheckedError::~CheckedError((CheckedError *)this);
                FlatBufferBuilderImpl<false>::AddElement<double>
                          (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                           (double)CONCAT44(builder.buf_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                            CONCAT22(builder.buf_.
                                                                                                          
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                                  CONCAT11(builder.buf_.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))));
              }
            }
            else {
              anon_unknown_0::atot<double>
                        ((anon_unknown_0 *)this,
                         *(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18),
                         (Parser *)struct_def,(double *)&builder);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              anon_unknown_0::atot<double>
                        ((anon_unknown_0 *)this,*(char **)(lVar19 + 0xe8),(Parser *)struct_def,
                         (double *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00119f8b;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddElement<double>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (double)CONCAT44(builder.buf_.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          CONCAT22(builder.buf_.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                                  CONCAT11(builder.buf_.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (uchar)builder.buf_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start))),
                         (double)CONCAT44(val.type.element,
                                          CONCAT22(val.type.base_type._2_2_,
                                                   CONCAT11(val.type.base_type._1_1_,
                                                            (undefined1)val.type.base_type))));
            }
            break;
          case 0xd:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if ((*(int *)(lVar19 + 200) == 0xf) &&
               (struct_def_00 = *(StructDef **)(lVar19 + 0xd0), struct_def_00->fixed != false)) {
LAB_0011a6aa:
              SerializeStruct((Parser *)struct_def,struct_def_00,val_00);
            }
            else if (*(char *)(lVar19 + 0x115) == '\0') {
              OVar12.o = atoi(*(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18));
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddOffset<void>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),OVar12);
            }
            else {
              iVar11 = atoi(*(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18));
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddOffset<void>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (Offset64<void>)(long)iVar11);
            }
            break;
          case 0xe:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if ((*(int *)(lVar19 + 200) == 0xf) &&
               (struct_def_00 = *(StructDef **)(lVar19 + 0xd0), struct_def_00->fixed != false))
            goto LAB_0011a6aa;
            if (*(char *)(lVar19 + 0x115) == '\0') {
              OVar12.o = atoi(*(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18));
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddOffset<void>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),OVar12);
            }
            else {
              iVar11 = atoi(*(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18));
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddOffset<void>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (Offset64<void>)(long)iVar11);
            }
            break;
          case 0xf:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if ((*(int *)(lVar19 + 200) == 0xf) &&
               (struct_def_00 = *(StructDef **)(lVar19 + 0xd0), struct_def_00->fixed != false))
            goto LAB_0011a6aa;
            if (*(char *)(lVar19 + 0x115) == '\0') {
              OVar12.o = atoi(*(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18));
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddOffset<void>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),OVar12);
            }
            else {
              iVar11 = atoi(*(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18));
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddOffset<void>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (Offset64<void>)(long)iVar11);
            }
            break;
          case 0x10:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if ((*(int *)(lVar19 + 200) == 0xf) &&
               (struct_def_00 = *(StructDef **)(lVar19 + 0xd0), struct_def_00->fixed == true))
            goto LAB_0011a6aa;
            if (*(char *)(lVar19 + 0x115) == '\0') {
              OVar12.o = atoi(*(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18));
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddOffset<void>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),OVar12);
            }
            else {
              iVar11 = atoi(*(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18));
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddOffset<void>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (Offset64<void>)(long)iVar11);
            }
            break;
          case 0x11:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            puVar15 = *(uint8_t **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18);
            sVar14 = InlineSize((Type *)val_00);
            vector_downward<unsigned_int>::push
                      ((vector_downward<unsigned_int> *)pFVar2,puVar15,sVar14);
            break;
          case 0x12:
            vector_downward<unsigned_int>::fill
                      ((vector_downward<unsigned_int> *)pFVar2,*(size_t *)(lVar19 + 0x128));
            if ((*(int *)(lVar19 + 200) == 0xf) &&
               (struct_def_00 = *(StructDef **)(lVar19 + 0xd0), struct_def_00->fixed != false))
            goto LAB_0011a6aa;
            if (*(char *)(lVar19 + 0x115) == '\0') {
              iVar11 = atoi(*(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18));
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddOffset<void>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (Offset64<void>)(long)iVar11);
            }
            else {
              iVar11 = atoi(*(char **)((long)(pVVar20 + 0xffffffffffffffff) + 0x18));
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
              CheckedError::~CheckedError((CheckedError *)this);
              FlatBufferBuilderImpl<false>::AddOffset<void>
                        (pFVar2,*(voffset_t *)((long)(pVVar20 + 0xffffffffffffffff) + 0x38),
                         (Offset64<void>)(long)iVar11);
            }
          }
        }
        pVVar20 = val_00;
        pVVar13 = *(Value **)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header
        ;
      }
    }
    while (bVar9 = local_1a8 != (StructDef *)0x0,
          local_1a8 = (StructDef *)
                      ((long)&local_1a8[-1].reserved_ids.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 7), bVar9) {
      std::
      vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
      ::pop_back((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                  *)&struct_def[5].fields);
    }
    if (value[8].field_2._M_local_buf[0] == '\0') {
      uVar10 = FlatBufferBuilderImpl<false>::EndTable(pFVar2,uVar10);
      if (in_R8 != (uoffset_t *)0x0) {
        *in_R8 = uVar10;
      }
      if (ovalue != (uoffset_t *)0x0) {
        NumToString<unsigned_int>((string *)&builder,uVar10);
        std::__cxx11::string::operator=((string *)ovalue,(string *)&builder);
        std::__cxx11::string::~string((string *)&builder);
      }
    }
    else {
      *(ulong *)&struct_def[1].fields.dict._M_t._M_impl =
           *(long *)&struct_def[1].fields.dict._M_t._M_impl +
           (ulong)struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color *
           -8;
      struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      *(undefined2 *)
       &struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 = 0;
      if (ovalue == (uoffset_t *)0x0) {
        __assert_fail("value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                      ,0x676,
                      "CheckedError flatbuffers::Parser::ParseTable(const StructDef &, std::string *, uoffset_t *)"
                     );
      }
      puVar15 = vector_downward<unsigned_int>::data((vector_downward<unsigned_int> *)pFVar2);
      std::__cxx11::string::assign((char *)ovalue,(ulong)puVar15);
      pcVar5 = value[9]._M_dataplus._M_p;
      ppsVar3 = &struct_def[1].super_Definition.declaration_file;
      *ppsVar3 = (string *)(pcVar5 + (long)&((*ppsVar3)->_M_dataplus)._M_p);
      puVar4 = &struct_def[1].super_Definition.serialized_location;
      *puVar4 = *puVar4 - (int)pcVar5;
      if (in_R8 != (uoffset_t *)0x0) {
        __assert_fail("!ovalue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                      ,0x67d,
                      "CheckedError flatbuffers::Parser::ParseTable(const StructDef &, std::string *, uoffset_t *)"
                     );
      }
    }
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_00119f8b:
  CheckedError::~CheckedError(&ce_1);
LAB_00119f95:
  (depth_guard.parser_)->parse_depth_counter_ = (depth_guard.parser_)->parse_depth_counter_ + -1;
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseTable(const StructDef &struct_def, std::string *value,
                                uoffset_t *ovalue) {
  ParseDepthGuard depth_guard(this);
  ECHECK(depth_guard.Check());

  size_t fieldn_outer = 0;
  auto err = ParseTableDelimiters(
      fieldn_outer, &struct_def,
      [&](const std::string &name, size_t &fieldn,
          const StructDef *struct_def_inner) -> CheckedError {
        if (name == "$schema") {
          ECHECK(Expect(kTokenStringConstant));
          return NoError();
        }
        auto field = struct_def_inner->fields.Lookup(name);
        if (!field) {
          if (!opts.skip_unexpected_fields_in_json) {
            return Error("unknown field: " + name);
          } else {
            ECHECK(SkipAnyJsonValue());
          }
        } else {
          if (IsIdent("null") && !IsScalar(field->value.type.base_type)) {
            ECHECK(Next());  // Ignore this field.
          } else {
            Value val = field->value;
            if (field->flexbuffer) {
              flexbuffers::Builder builder(1024,
                                           flexbuffers::BUILDER_FLAG_SHARE_ALL);
              ECHECK(ParseFlexBufferValue(&builder));
              builder.Finish();
              // Force alignment for nested flexbuffer
              builder_.ForceVectorAlignment(builder.GetSize(), sizeof(uint8_t),
                                            sizeof(largest_scalar_t));
              auto off = builder_.CreateVector(builder.GetBuffer());
              val.constant = NumToString(off.o);
            } else if (field->nested_flatbuffer) {
              ECHECK(
                  ParseNestedFlatbuffer(val, field, fieldn, struct_def_inner));
            } else {
              ECHECK(ParseAnyValue(val, field, fieldn, struct_def_inner, 0));
            }
            // Hardcoded insertion-sort with error-check.
            // If fields are specified in order, then this loop exits
            // immediately.
            auto elem = field_stack_.rbegin();
            for (; elem != field_stack_.rbegin() + fieldn; ++elem) {
              auto existing_field = elem->second;
              if (existing_field == field)
                return Error("field set more than once: " + field->name);
              if (existing_field->value.offset < field->value.offset) break;
            }
            // Note: elem points to before the insertion point, thus .base()
            // points to the correct spot.
            field_stack_.insert(elem.base(), std::make_pair(val, field));
            fieldn++;
          }
        }
        return NoError();
      });
  ECHECK(err);

  // Check if all required fields are parsed.
  for (auto field_it = struct_def.fields.vec.begin();
       field_it != struct_def.fields.vec.end(); ++field_it) {
    auto required_field = *field_it;
    if (!required_field->IsRequired()) { continue; }
    bool found = false;
    for (auto pf_it = field_stack_.end() - fieldn_outer;
         pf_it != field_stack_.end(); ++pf_it) {
      auto parsed_field = pf_it->second;
      if (parsed_field == required_field) {
        found = true;
        break;
      }
    }
    if (!found) {
      return Error("required field is missing: " + required_field->name +
                   " in " + struct_def.name);
    }
  }

  if (struct_def.fixed && fieldn_outer != struct_def.fields.vec.size())
    return Error("struct: wrong number of initializers: " + struct_def.name);

  auto start = struct_def.fixed ? builder_.StartStruct(struct_def.minalign)
                                : builder_.StartTable();

  for (size_t size = struct_def.sortbysize ? sizeof(largest_scalar_t) : 1; size;
       size /= 2) {
    // Go through elements in reverse, since we're building the data backwards.
    // TODO(derekbailey): this doesn't work when there are Offset64 fields, as
    // those have to be built first. So this needs to be changed to iterate over
    // Offset64 then Offset32 fields.
    for (auto it = field_stack_.rbegin();
         it != field_stack_.rbegin() + fieldn_outer; ++it) {
      auto &field_value = it->first;
      auto field = it->second;
      if (!struct_def.sortbysize ||
          size == SizeOf(field_value.type.base_type)) {
        switch (field_value.type.base_type) {
          // clang-format off
          #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
            case BASE_TYPE_ ## ENUM: \
              builder_.Pad(field->padding); \
              if (struct_def.fixed) { \
                CTYPE val; \
                ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                builder_.PushElement(val); \
              } else { \
                if (field->IsScalarOptional()) { \
                  if (field_value.constant != "null") { \
                    CTYPE val; \
                    ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                    builder_.AddElement(field_value.offset, val); \
                  } \
                } else { \
                  CTYPE val, valdef; \
                  ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                  ECHECK(atot(field->value.constant.c_str(), *this, &valdef)); \
                  builder_.AddElement(field_value.offset, val, valdef); \
                } \
              } \
              break;
            FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
          #undef FLATBUFFERS_TD
          #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
            case BASE_TYPE_ ## ENUM: \
              builder_.Pad(field->padding); \
              if (IsStruct(field->value.type)) { \
                SerializeStruct(*field->value.type.struct_def, field_value); \
              } else { \
                /* Special case for fields that use 64-bit addressing */ \
                if(field->offset64) { \
                  Offset64<void> offset; \
                  ECHECK(atot(field_value.constant.c_str(), *this, &offset)); \
                  builder_.AddOffset(field_value.offset, offset); \
                } else { \
                  CTYPE val; \
                  ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                  builder_.AddOffset(field_value.offset, val); \
                } \
              } \
              break;
            FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
          #undef FLATBUFFERS_TD
            case BASE_TYPE_ARRAY:
              builder_.Pad(field->padding);
              builder_.PushBytes(
                reinterpret_cast<const uint8_t*>(field_value.constant.c_str()),
                InlineSize(field_value.type));
              break;
            // clang-format on
        }
      }
    }
  }